

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O2

Flag<TestConfig> *
anon_unknown.dwarf_4954b::CredentialFlagWithDefault
          (Flag<TestConfig> *__return_storage_ptr__,Flag<TestConfig> *default_flag,
          Flag<CredentialConfig> *flag)

{
  bool bVar1;
  char *__s2;
  int iVar2;
  Flag<TestConfig> *this;
  Flag<TestConfig> local_80;
  Flag<CredentialConfig> local_50;
  
  __s2 = flag->name;
  iVar2 = strcmp(default_flag->name,__s2);
  if ((iVar2 == 0) && (bVar1 = default_flag->has_param, bVar1 == flag->has_param)) {
    __return_storage_ptr__->name = __s2;
    __return_storage_ptr__->has_param = bVar1;
    __return_storage_ptr__->skip_handshaker = false;
    Flag<TestConfig>::Flag(&local_80,default_flag);
    Flag<CredentialConfig>::Flag(&local_50,flag);
    (__return_storage_ptr__->set_param).super__Function_base._M_manager = (_Manager_type)0x0;
    (__return_storage_ptr__->set_param)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__return_storage_ptr__->set_param).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->set_param).super__Function_base._M_functor + 8)
         = 0;
    this = (Flag<TestConfig> *)operator_new(0x60);
    Flag<TestConfig>::Flag(this,&local_80);
    Flag<CredentialConfig>::Flag((Flag<CredentialConfig> *)(this + 1),&local_50);
    *(Flag<TestConfig> **)&(__return_storage_ptr__->set_param).super__Function_base._M_functor =
         this;
    (__return_storage_ptr__->set_param)._M_invoker =
         std::
         _Function_handler<bool_(TestConfig_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc:278:27)>
         ::_M_invoke;
    (__return_storage_ptr__->set_param).super__Function_base._M_manager =
         std::
         _Function_handler<bool_(TestConfig_*,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/test_config.cc:278:27)>
         ::_M_manager;
    (anonymous_namespace)::
    CredentialFlagWithDefault((anonymous_namespace)::Flag<TestConfig>,(anonymous_namespace)::Flag<CredentialConfig>)
    ::$_0::~__0((__0 *)&local_80);
    return __return_storage_ptr__;
  }
  abort();
}

Assistant:

Flag<TestConfig> CredentialFlagWithDefault(Flag<TestConfig> default_flag,
                                           Flag<CredentialConfig> flag) {
  BSSL_CHECK(strcmp(default_flag.name, flag.name) == 0);
  BSSL_CHECK(default_flag.has_param == flag.has_param);
  return Flag<TestConfig>{flag.name, flag.has_param, /*skip_handshaker=*/false,
                          [=](TestConfig *config, const char *param) -> bool {
                            if (config->credentials.empty()) {
                              return default_flag.set_param(config, param);
                            }
                            return flag.set_param(&config->credentials.back(),
                                                  param);
                          }};
}